

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

V5_horizontal_alignment
ON_INTERNAL_OBSOLETE::V5HorizontalAlignmentFromV5Justification(uint v5_justification_bits)

{
  V5_horizontal_alignment VVar1;
  
  VVar1 = Center;
  if ((v5_justification_bits & 7) != 2) {
    VVar1 = ((v5_justification_bits & 7) == 4) * '\x02';
  }
  return VVar1;
}

Assistant:

ON_INTERNAL_OBSOLETE::V5_horizontal_alignment ON_INTERNAL_OBSOLETE::V5HorizontalAlignmentFromV5Justification(
    unsigned int v5_justification_bits
  )
{
  ON_INTERNAL_OBSOLETE::V5_horizontal_alignment halign = ON_INTERNAL_OBSOLETE::V5_horizontal_alignment::Left;

  const unsigned int v5_halign_mask
    = ON_OBSOLETE_V5_TextObject::eTextJustification::tjLeft
    | ON_OBSOLETE_V5_TextObject::eTextJustification::tjCenter
    | ON_OBSOLETE_V5_TextObject::eTextJustification::tjRight;

  if (ON_OBSOLETE_V5_TextObject::eTextJustification::tjCenter == (v5_justification_bits & v5_halign_mask))
    halign = ON_INTERNAL_OBSOLETE::V5_horizontal_alignment::Center;
  else if (ON_OBSOLETE_V5_TextObject::eTextJustification::tjRight == (v5_justification_bits & v5_halign_mask))
    halign = ON_INTERNAL_OBSOLETE::V5_horizontal_alignment::Right;

  return halign;
}